

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

void xmlSchemaPContentErr
               (xmlSchemaParserCtxtPtr ctxt,xmlParserErrors error,xmlSchemaBasicItemPtr ownerItem,
               xmlNodePtr ownerElem,xmlNodePtr child,char *message,char *content)

{
  xmlChar *local_40;
  xmlChar *des;
  char *message_local;
  xmlNodePtr child_local;
  xmlNodePtr ownerElem_local;
  xmlSchemaBasicItemPtr ownerItem_local;
  xmlSchemaParserCtxtPtr pxStack_10;
  xmlParserErrors error_local;
  xmlSchemaParserCtxtPtr ctxt_local;
  
  local_40 = (xmlChar *)0x0;
  des = (xmlChar *)message;
  message_local = (char *)child;
  child_local = ownerElem;
  ownerElem_local = (xmlNodePtr)ownerItem;
  ownerItem_local._4_4_ = error;
  pxStack_10 = ctxt;
  xmlSchemaFormatItemForReport(&local_40,(xmlChar *)0x0,ownerItem,ownerElem);
  if (des == (xmlChar *)0x0) {
    if (content == (char *)0x0) {
      xmlSchemaPErr2(pxStack_10,child_local,(xmlNodePtr)message_local,ownerItem_local._4_4_,
                     "%s: The content is not valid.\n",local_40,(xmlChar *)0x0);
    }
    else {
      xmlSchemaPErr2(pxStack_10,child_local,(xmlNodePtr)message_local,ownerItem_local._4_4_,
                     "%s: The content is not valid. Expected is %s.\n",local_40,(xmlChar *)content);
    }
  }
  else {
    xmlSchemaPErr2(pxStack_10,child_local,(xmlNodePtr)message_local,ownerItem_local._4_4_,
                   "%s: %s.\n",local_40,des);
  }
  if (local_40 != (xmlChar *)0x0) {
    (*xmlFree)(local_40);
  }
  return;
}

Assistant:

FREE_AND_NULL(msg)
}

/**
 * xmlSchemaPContentErr:
 * @ctxt: the schema parser context
 * @error: the error code
 * @ownerItem: the owner item of the holder of the content
 * @ownerElem: the node of the holder of the content
 * @child: the invalid child node
 * @message: the optional error message
 * @content: the optional string describing the correct content
 *
 * Reports an error concerning the content of a schema element.
 */
static void
xmlSchemaPContentErr(xmlSchemaParserCtxtPtr ctxt,
		     xmlParserErrors error,
		     xmlSchemaBasicItemPtr ownerItem,
		     xmlNodePtr ownerElem,
		     xmlNodePtr child,
		     const char *message,
		     const char *content)
{
    xmlChar *des = NULL;

    xmlSchemaFormatItemForReport(&des, NULL, ownerItem, ownerElem);
    if (message != NULL)
	xmlSchemaPErr2(ctxt, ownerElem, child, error,
	    "%s: %s.\n",
	    BAD_CAST des, BAD_CAST message);
    else {
	if (content != NULL) {
	    xmlSchemaPErr2(ctxt, ownerElem, child, error,
		"%s: The content is not valid. Expected is %s.\n",
		BAD_CAST des, BAD_CAST content);
	} else {
	    xmlSchemaPErr2(ctxt, ownerElem, child, error,
		"%s: The content is not valid.\n",
		BAD_CAST des, NULL);
	}
    }
    FREE_AND_NULL(des)
}